

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

void __thiscall
CholeskyFactor::reduce(CholeskyFactor *this,QpVector *buffer_d,HighsInt maxabsd,bool p_in_v)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  ulong uVar4;
  int iVar5;
  HighsInt j;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  pointer pdVar11;
  pointer pdVar12;
  long lVar13;
  uint uVar14;
  vector<double,_std::allocator<double>_> row_p;
  allocator_type local_59;
  QpVector *local_58;
  vector<double,_std::allocator<double>_> local_50;
  value_type_conflict1 local_38;
  
  if ((long)this->current_k == 0) {
    return;
  }
  if (this->uptodate != true) {
    return;
  }
  this->numberofreduces = this->numberofreduces + 1;
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_50,(long)this->current_k,&local_38,&local_59);
  uVar14 = this->current_k;
  uVar4 = (ulong)uVar14;
  if (0 < (long)(int)uVar14) {
    iVar5 = this->current_k_max;
    pdVar11 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] = pdVar11[(uint)(iVar5 * maxabsd + (int)uVar10)];
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  lVar13 = (long)(int)uVar14 + -1;
  iVar5 = (int)lVar13;
  if (maxabsd < iVar5) {
    lVar7 = (long)this->current_k_max;
    pdVar12 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)maxabsd;
    pdVar11 = pdVar12 + lVar7 * lVar9;
    pdVar12 = pdVar12 + (lVar9 + 1) * lVar7;
    do {
      if (0 < (int)uVar14) {
        uVar10 = 0;
        do {
          pdVar11[uVar10] = pdVar12[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar4 != uVar10);
      }
      lVar9 = lVar9 + 1;
      pdVar11 = pdVar11 + lVar7;
      pdVar12 = pdVar12 + lVar7;
    } while (lVar9 != lVar13);
  }
  if (0 < (int)uVar14) {
    iVar6 = this->current_k_max;
    pdVar11 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      pdVar11[(long)iVar6 * (long)iVar5 + uVar10] =
           local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
    if (0 < (int)uVar14) {
      iVar6 = this->current_k_max;
      pdVar12 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar11 = pdVar12 + 1;
      uVar10 = 0;
      do {
        lVar7 = uVar10 * (long)iVar6;
        dVar1 = pdVar12[(uint)(maxabsd + (int)lVar7)];
        lVar13 = (long)maxabsd;
        if (maxabsd < iVar5) {
          do {
            pdVar11[lVar13 + -1] = pdVar11[lVar13];
            lVar13 = lVar13 + 1;
          } while (iVar5 != lVar13);
        }
        pdVar12[uVar4 + lVar7 + -1] = dVar1;
        uVar10 = uVar10 + 1;
        pdVar11 = pdVar11 + iVar6;
      } while (uVar10 != uVar4);
      j = 0;
      local_58 = buffer_d;
      if (uVar14 == 1) goto LAB_00336654;
    }
  }
  if (!p_in_v) {
    if (0 < maxabsd) {
      uVar14 = maxabsd + 1;
      do {
        eliminate(this,&this->L,this->current_k + -1,uVar14 - 2,this->current_k_max,this->current_k)
        ;
        uVar14 = uVar14 - 1;
      } while (1 < uVar14);
    }
    iVar5 = buffer_d->num_nz;
    if (0 < (long)iVar5) {
      piVar3 = (buffer_d->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = (buffer_d->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar6 = this->current_k;
      iVar8 = (iVar6 + -1) * this->current_k_max;
      pdVar12 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar13 = 0;
      do {
        iVar2 = piVar3[lVar13];
        if (iVar2 != maxabsd) {
          lVar7 = (long)(iVar2 + iVar8);
          pdVar12[(ulong)(iVar2 < maxabsd) + lVar7 + -1] =
               pdVar12[(ulong)(iVar2 < maxabsd) + lVar7 + -1] -
               (pdVar11[iVar2] / pdVar11[maxabsd]) * pdVar12[(long)(iVar6 + iVar8) + -1];
        }
        lVar13 = lVar13 + 1;
      } while (iVar5 != lVar13);
    }
  }
  iVar5 = this->current_k;
  j = iVar5 + -1;
  if (1 < iVar5) {
    iVar6 = 0;
    do {
      eliminate(this,&this->L,iVar6,j,this->current_k_max,iVar5);
      iVar6 = iVar6 + 1;
      iVar5 = this->current_k;
      j = iVar5 + -1;
    } while (iVar6 < j);
  }
LAB_00336654:
  this->current_k = j;
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void reduce(const QpVector& buffer_d, const HighsInt maxabsd, bool p_in_v) {
    if (current_k == 0) {
      return;
    }
    if (!uptodate) {
      return;
    }
    numberofreduces++;

    unsigned p = maxabsd;  // col we push to the right and remove

    // start situation: p=3, current_k = 5
    // |1 x  | |x    |       |1   | |xxxxx|
    // | 1x  | |xx   |  ===  | 1  | | xxxx|
    // |  x1 | |xxx  |       |xxxx| |  xxx|
    // |  x 1| |xxxx |       |  1 | |   xx|
    //         |xxxxx|       |   1| |    x|
    // next step: move row/col p to the bottom/right

    //> save row p
    std::vector<double> row_p(current_k, 0.0);
    for (HighsInt i = 0; i < current_k; i++) {
      row_p[i] = L[p * current_k_max + i];
    }

    //> move all rows > p up by one row
    for (HighsInt row = p; row < current_k - 1; row++) {
      for (HighsInt i = 0; i < current_k; i++) {
        L[row * current_k_max + i] = L[(row + 1) * current_k_max + i];
      }
    }

    //> load row p
    for (HighsInt i = 0; i < current_k; i++) {
      L[(current_k - 1) * current_k_max + i] = row_p[i];
    }

    //> now move col p to the right in each row
    for (HighsInt row = 0; row < current_k; row++) {
      double p_entry = L[row * current_k_max + p];
      for (HighsInt col = p; col < current_k - 1; col++) {
        L[row * current_k_max + col] = L[row * current_k_max + col + 1];
      }
      L[row * current_k_max + current_k - 1] = p_entry;
    }

    if (current_k == 1) {
      current_k--;
      return;
    }

    if (!p_in_v) {
      // situation now:
      // |1   x| |x    |       |1   | |xxxxx|
      // | 1  x| |xx   |  ===  | 1  | | xxxx|
      // |  1 x| |xxx x|       |  1 | |  xx |
      // |   1x| |xxxxx|       |   1| |   x |
      //         |xx  x|       |xxxx| |  xxx|
      // next: remove nonzero entries in last column except for diagonal element
      for (HighsInt r = (HighsInt)p - 1; r >= 0; r--) {  // to current_k-1
        eliminate(L, current_k - 1, r, current_k_max, current_k);
      }

      // situation now:
      // |1   x| |x   x|        |xxxx | |1   |
      // | 1  x| |xx  x|  ===   | xxx | | 1  |
      // |  1 x| |xxx x|        |  xx | |  1 |
      // |   1x| |xxxxx|        |   x | |   1|
      //         |    x|        |xxxxx| |xxxx|
      // next: multiply product
      // new last row: old last row (first current_k-1 elements) + r *
      // R_current_k_current_k

      for (HighsInt i = 0; i < buffer_d.num_nz; i++) {
        HighsInt idx = buffer_d.index[i];
        if (idx == maxabsd) {
          continue;
        }
        if (idx < maxabsd) {
          L[(current_k - 1) * current_k_max + idx] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        } else {
          L[(current_k - 1) * current_k_max + idx - 1] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        }
      }
      // situation now: as above, but no more product
    }
    // next: eliminate last row
    for (HighsInt i = 0; i < current_k - 1; i++) {
      eliminate(L, i, current_k - 1, current_k_max, current_k);
    }
    current_k--;
  }